

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O1

StateNode * __thiscall
QDateTimeParser::scanString
          (StateNode *__return_storage_ptr__,QDateTimeParser *this,QDateTime *defaultValue,
          bool fixup)

{
  QString *pQVar1;
  long lVar2;
  StateNode *pSVar3;
  QCalendar *this_00;
  int ms;
  int s;
  int m;
  qsizetype qVar4;
  QTimeZone QVar5;
  bool bVar6;
  int iVar7;
  QFlagsStorage<QDateTimeParser::Section> QVar8;
  FieldInfo FVar9;
  Section SVar10;
  int iVar11;
  int iVar12;
  time_t tVar13;
  ulong uVar14;
  Data DVar15;
  int *piVar16;
  ushort *puVar17;
  SectionNode *pSVar18;
  QDate QVar19;
  time_t *__timer;
  bool bVar20;
  undefined7 in_register_00000009;
  QtPrivate *pQVar21;
  QLocale *locale;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint uVar22;
  storage_type_conflict *psVar23;
  QDateTimeParser *__timer_00;
  QTimeZone *this_01;
  long lVar24;
  int iVar25;
  ulong uVar26;
  QtPrivate *this_02;
  int iVar27;
  State SVar28;
  State SVar29;
  long in_FS_OFFSET;
  bool bVar30;
  bool bVar31;
  SectionNode sn;
  SectionNode sn_00;
  QStringView separator;
  QLatin1StringView needle;
  QStringView rhs;
  QStringView rhs_00;
  QStringView string;
  QStringView separator_00;
  ParsedSection PVar32;
  QStringView text;
  QStringView haystack;
  QLatin1StringView lhs;
  QLatin1StringView lhs_00;
  QStringView name;
  QStringView text_00;
  QFlagsStorage<QDateTimeParser::Section> local_18c;
  int hour;
  int local_17c;
  int local_178;
  int ampm;
  QCalendar *local_170;
  StateNode *local_168;
  int dayofweek;
  int hour12;
  QString *local_158;
  storage_type_conflict *local_150;
  int msec;
  int second;
  int minute;
  int year2digits;
  ulong local_138;
  qsizetype local_130;
  State *local_128;
  ulong local_120;
  undefined4 local_114;
  long local_110;
  QString *local_108;
  QDateTimeParser *local_100;
  undefined1 *local_f8;
  QDate local_f0;
  long local_e8;
  int zoneOffset;
  undefined4 uStack_dc;
  QTime time;
  QDate local_d0;
  QString local_c8;
  QMessageLogger local_b0;
  QTimeZone namedZone;
  QDate date;
  QDateTime when;
  QTimeZone timeZone;
  QTime defaultTime;
  QDate defaultDate;
  int day;
  int month;
  int year;
  long local_38;
  
  local_114 = (undefined4)CONCAT71(in_register_00000009,fixup);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = (this->sectionNodes).d.size;
  year = -0x55555556;
  month = -0x55555556;
  day = -0x55555556;
  defaultDate.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  __timer_00 = this;
  local_168 = __return_storage_ptr__;
  defaultDate = QDateTime::date(defaultValue);
  defaultTime.mds = -0x55555556;
  tVar13 = QDateTime::time(defaultValue,(time_t *)__timer_00);
  defaultTime.mds = (int)tVar13;
  QDate::getDate(&defaultDate,&year,&month,&day);
  year2digits = year % 100;
  hour = QTime::hour(&defaultTime);
  hour12 = -1;
  minute = QTime::minute(&defaultTime);
  second = QTime::second(&defaultTime);
  msec = QTime::msec(&defaultTime);
  local_170 = &this->calendar;
  dayofweek = QCalendar::dayOfWeek(local_170,defaultDate);
  qVar4 = local_130;
  timeZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::timeRepresentation((QDateTime *)&timeZone);
  ampm = -1;
  uVar22 = (uint)qVar4;
  bVar30 = 0 < (int)uVar22;
  if ((int)uVar22 < 1) {
    local_18c.i = 0;
    SVar28 = Acceptable;
    iVar12 = 0;
    local_17c = 0;
    bVar20 = false;
  }
  else {
    local_108 = &this->m_text;
    local_128 = &local_168->state;
    local_f8 = (undefined1 *)(ulong)(uVar22 & 0x7fffffff);
    local_150 = (storage_type_conflict *)CONCAT44(local_150._4_4_,2);
    lVar24 = 0x10;
    local_110 = 8;
    local_158 = (QString *)0x0;
    bVar20 = false;
    local_17c = 0;
    iVar12 = 0;
    local_18c.i = 0;
    local_100 = this;
    do {
      text.m_data = (this->m_text).d.ptr + iVar12;
      pQVar1 = (this->separators).d.ptr;
      text.m_size = (this->m_text).d.size - (long)iVar12;
      separator.m_data = *(storage_type_conflict **)((long)pQVar1 + lVar24 + -8);
      separator.m_size = *(qsizetype *)((long)&(pQVar1->d).d + lVar24);
      local_e8 = lVar24;
      iVar7 = matchesSeparator(text,separator);
      if (iVar7 == -1) {
        QDateTime::QDateTime(&local_168->value);
        *(bool *)(local_128 + 2) = false;
        local_128[0] = Invalid;
        local_128[1] = Invalid;
        bVar6 = true;
        SVar28 = (State)local_150;
      }
      else {
        local_178 = iVar7 + iVar12;
        pSVar18 = (this->sectionNodes).d.ptr;
        *(int *)((long)pSVar18 + local_110 + -4) = local_178;
        zoneOffset = 0xaaaaaaaa;
        local_138 = (ulong)*(uint *)((long)pSVar18 + local_110 + -8);
        local_120 = (ulong)*(uint *)((long)&pSVar18->type + local_110);
        when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        local_f0 = actualDate((Sections)local_18c.i,(this->calendar).d_ptr,this->defaultCenturyStart
                              ,year,year2digits,month,day,dayofweek);
        m = minute;
        s = second;
        ms = msec;
        iVar25 = hour12;
        iVar7 = ampm;
        iVar11 = hour;
        date.jd._0_4_ = 0xaaaaaaaa;
        QTime::QTime((QTime *)&date,hour,minute,second,msec);
        iVar12 = iVar11 >> 0x1f;
        QVar8.i = local_18c.i;
        if (0xc < (uint)iVar25) {
          QVar8.i = local_18c.i & 0xffffffef;
          iVar25 = iVar11 + (((uint)(iVar11 / 6 + iVar12) >> 1) - iVar12) * -0xc;
        }
        iVar27 = iVar11;
        if ((iVar7 == -1) || ((QVar8.i & 1) == 0)) {
          if (((QVar8.i & 0x10) != 0) &&
             (iVar11 + (((uint)(iVar11 / 6 + iVar12) >> 1) - iVar12) * -0xc != iVar25)) {
            if (((QVar8.i & 0x20) == 0) && (iVar27 = iVar25 + 0xc, iVar11 < 0xd)) {
              iVar27 = iVar25;
            }
            goto LAB_0041946b;
          }
        }
        else {
          iVar7 = iVar7 * 0xc;
          if (iVar11 - iVar25 != iVar7) {
            if (((QVar8.i & 0x20) == 0) && (iVar27 = iVar25 + iVar7, (QVar8.i & 0x10) == 0)) {
              iVar27 = iVar11;
            }
LAB_0041946b:
            QTime::QTime((QTime *)&namedZone,iVar27,m,s,ms);
            date.jd._0_4_ = namedZone.d._0_4_;
          }
        }
        QDateTime::QDateTime(&when,local_f0,(QTime)date.jd._0_4_,&timeZone,LegacyBehavior);
        this = local_100;
        PVar32 = parseSection(local_100,&when,(int)local_158,local_178);
        uVar26 = PVar32._0_8_;
        SVar28 = PVar32.state;
        if (((((char)local_114 != '\0') && (SVar28 == Intermediate)) &&
            (PVar32.used < (int)local_120)) &&
           (FVar9 = fieldInfo(this,(int)local_158),
           (~(uint)FVar9.super_QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>.
                   super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i & 3) == 0)) {
          date.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
          QString::asprintf((char **)&date,"%0*d",local_120,uVar26 & 0xffffffff);
          QString::replace(local_108,(long)local_178,(long)uVar26 >> 0x20,(QString *)&date);
          if (date.jd != 0) {
            LOCK();
            *(int *)date.jd = *(int *)date.jd + -1;
            UNLOCK();
            if (*(int *)date.jd == 0) {
              QArrayData::deallocate((QArrayData *)date.jd,2,0x10);
            }
          }
          uVar26 = uVar26 & 0xffffffff | local_120 << 0x20;
        }
        if ((int)(State)local_150 < (int)SVar28) {
          SVar28 = (State)local_150;
        }
        if ((SVar28 == Invalid) ||
           ((this->context == FromString && (PVar32.zeroes != 0 || SVar28 == Intermediate)))) {
          QDateTime::QDateTime(&local_168->value);
          *(bool *)(local_128 + 2) = false;
          local_128[0] = Invalid;
          local_128[1] = Invalid;
          bVar6 = true;
          iVar12 = local_178;
        }
        else {
          SVar10 = (Section)local_138;
          iVar12 = (int)uVar26;
          if ((int)SVar10 < 0x100) {
            if ((int)SVar10 < 0x10) {
              switch(SVar10) {
              case AmPmSection:
                piVar16 = &ampm;
                break;
              case MSecSection:
                piVar16 = &msec;
                break;
              default:
switchD_00419641_caseD_3:
                local_b0.context.version = 2;
                local_b0.context._4_8_ = 0;
                local_b0.context._12_8_ = 0;
                local_b0.context.function._4_4_ = 0;
                local_b0.context.category = "default";
                SectionNode::name(&local_c8,SVar10);
                puVar17 = QString::utf16(&local_c8);
                iVar12 = local_178;
                QMessageLogger::warning
                          (&local_b0,"QDateTimeParser::parse Internal error (%ls)",puVar17);
                scanString();
                bVar6 = true;
                goto LAB_004199a7;
              case SecondSection:
                piVar16 = &second;
                break;
              case MinuteSection:
                piVar16 = &minute;
              }
            }
            else if (SVar10 == Hour12Section) {
              piVar16 = &hour12;
            }
            else if (SVar10 == Hour24Section) {
              piVar16 = &hour;
            }
            else {
              if (SVar10 != TimeZoneSection) goto switchD_00419641_caseD_3;
              this_02 = (QtPrivate *)(uVar26 >> 0x20);
              iVar7 = (int)(uVar26 >> 0x20);
              if (0 < iVar7) {
                psVar23 = (this->m_text).d.ptr + local_178;
                needle.m_data = "UTC";
                needle.m_size = 3;
                haystack.m_data = psVar23;
                haystack.m_size = (qsizetype)this_02;
                bVar6 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
                bVar31 = false;
                pQVar21 = this_02 + -3;
                if (!bVar6) {
                  pQVar21 = this_02;
                }
                lVar24 = 0;
                if (bVar6) {
                  lVar24 = 6;
                }
                if (pQVar21 != (QtPrivate *)0x0) {
                  bVar31 = *(short *)((long)psVar23 + lVar24) == 0x2b;
                  if ((pQVar21 != (QtPrivate *)0x0) && (*(short *)((long)psVar23 + lVar24) != 0x2b))
                  {
                    bVar31 = *(short *)((long)psVar23 + lVar24) == 0x2d;
                  }
                }
                local_150 = psVar23;
                if (iVar7 == 3) {
                  rhs_00.m_data = psVar23;
                  rhs_00.m_size = (qsizetype)this_02;
                  lhs_00.m_data = "UTC";
                  lhs_00.m_size = 3;
                  bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00);
LAB_00419823:
                  if ((bVar31 | bVar6) == 1) goto LAB_0041982c;
                  locale = (QLocale *)&date;
                  (*this->_vptr_QDateTimeParser[6])(locale,this);
                  name.m_data = local_150;
                  name.m_size = (qsizetype)this_02;
                  iVar12 = startsWithLocalTimeZone(name,&when,locale);
                  QLocale::~QLocale(locale);
                  QVar5 = timeZone;
                  if (iVar12 == iVar7) {
                    timeZone.d = (Data)(ShortData)0x1;
                    date.jd = (qint64)QVar5.d;
                    goto LAB_004198cb;
                  }
                  namedZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
                  string.m_data = (storage_type_conflict *)locale;
                  string.m_size = (qsizetype)local_150;
                  QtPrivate::convertToLatin1((QByteArray *)&date,this_02,string);
                  this_01 = &namedZone;
                  QTimeZone::QTimeZone(this_01,(QByteArray *)&date);
                  if (date.jd != 0) {
                    LOCK();
                    *(int *)date.jd = *(int *)date.jd + -1;
                    UNLOCK();
                    if (*(int *)date.jd == 0) {
                      QArrayData::deallocate((QArrayData *)date.jd,1,0x10);
                    }
                  }
                  QTimeZone::operator=(&timeZone,this_01);
                }
                else {
                  if ((iVar7 != 1) ||
                     (rhs.m_data = psVar23, rhs.m_size = (qsizetype)this_02, lhs.m_data = "Z",
                     lhs.m_size = 1, bVar6 = QtPrivate::equalStrings(lhs,rhs), !bVar6)) {
                    bVar6 = false;
                    goto LAB_00419823;
                  }
LAB_0041982c:
                  DVar15.d = (QTimeZonePrivate *)((3 - (ulong)(iVar12 == 0)) + (long)iVar12 * 4);
                  if (0x1c200 < (long)iVar12 + 0xe100U) {
                    DVar15.d = (QTimeZonePrivate *)0x0;
                  }
                  date.jd = (qint64)timeZone.d;
                  timeZone.d = DVar15;
LAB_004198cb:
                  this_01 = (QTimeZone *)&date;
                }
                QTimeZone::~QTimeZone(this_01);
              }
              piVar16 = &zoneOffset;
            }
          }
          else if ((int)SVar10 < 0x800) {
            if (SVar10 == DaySection) {
              uVar14 = 1;
              if (1 < iVar12) {
                uVar14 = uVar26 & 0xffffffff;
              }
              uVar26 = uVar26 & 0xffffffff00000000 | uVar14;
              piVar16 = &day;
            }
            else if (SVar10 == MonthSection) {
              piVar16 = &month;
            }
            else {
              if (SVar10 != YearSection) goto switchD_00419641_caseD_3;
              piVar16 = &year;
            }
          }
          else if (SVar10 == YearSection2Digits) {
            piVar16 = &year2digits;
          }
          else {
            if ((SVar10 != DayOfWeekSectionShort) && (SVar10 != DayOfWeekSectionLong))
            goto switchD_00419641_caseD_3;
            piVar16 = &dayofweek;
          }
          iVar12 = (int)(uVar26 >> 0x20);
          if (iVar12 == 0 || (long)uVar26 < 0) {
            iVar12 = 0;
          }
          iVar12 = iVar12 + local_178;
          if (((local_18c.i & (uint)local_138) != 0) && (*piVar16 != (int)uVar26)) {
            bVar6 = false;
            bVar20 = true;
            if (local_158 != (QString *)(ulong)(uint)this->currentSectionIndex) goto LAB_004199a7;
          }
          *piVar16 = (int)uVar26;
          local_18c.i = local_18c.i | (uint)local_138;
          bVar6 = false;
        }
LAB_004199a7:
        local_17c = local_17c + PVar32.zeroes;
        QDateTime::~QDateTime(&when);
      }
      if (bVar6) break;
      local_158 = (QString *)((long)&(local_158->d).d + 1);
      bVar30 = local_158 < local_f8;
      lVar24 = local_e8 + 0x18;
      local_110 = local_110 + 0x10;
      local_150 = (storage_type_conflict *)CONCAT44(local_150._4_4_,SVar28);
    } while ((QString *)local_f8 != local_158);
  }
  if (bVar30) goto LAB_0041a1af;
  lVar24 = (this->m_text).d.size;
  pQVar1 = (this->separators).d.ptr;
  text_00.m_data = (this->m_text).d.ptr + iVar12;
  text_00.m_size = lVar24 - iVar12;
  lVar2 = (this->separators).d.size;
  separator_00.m_data = pQVar1[lVar2 + -1].d.ptr;
  separator_00.m_size = pQVar1[lVar2 + -1].d.size;
  iVar7 = matchesSeparator(text_00,separator_00);
  if ((iVar7 == -1) || (iVar7 + iVar12 < lVar24)) {
LAB_00419b09:
    pSVar3 = local_168;
    QDateTime::QDateTime(&local_168->value);
    pSVar3->conflicts = false;
    pSVar3->state = Invalid;
    pSVar3->padded = 0;
    goto LAB_0041a1af;
  }
  SVar29 = SVar28;
  if (this->parserType != QTime) {
    bVar30 = bVar20;
    if ((year % 100 != year2digits) && ((local_18c.i & 0x800) != 0)) {
      date.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      date = actualDate((Sections)local_18c.i,(this->calendar).d_ptr,this->defaultCenturyStart,year,
                        year2digits,month,day,dayofweek);
      if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
        if ((local_18c.i >> 10 & 1) == 0) {
          year = QDate::year(&date);
        }
        else {
          pSVar18 = sectionNode(this,this->currentSectionIndex);
          bVar30 = true;
          if (pSVar18->type == YearSection2Digits) {
            year = QDate::year(&date);
          }
        }
      }
      else {
        SVar28 = Invalid;
      }
    }
    pSVar18 = sectionNode(this,this->currentSectionIndex);
    SVar10 = pSVar18->type;
    when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
    QDate::QDate((QDate *)&when,year,month,day,local_170->d_ptr);
    iVar12 = dayofweek;
    bVar20 = bVar30;
    if ((((0x16d3e147973 < (long)when.d + 0xb69eeff91fU) ||
         (iVar7 = QCalendar::dayOfWeek(local_170,(QDate)when.d), iVar12 != iVar7)) &&
        (SVar28 == Acceptable)) && ((local_18c.i & 0x3000) != 0)) {
      bVar20 = true;
      if ((local_18c.i >> 8 & 1) == 0) {
        bVar20 = bVar30;
      }
      if (((this->currentSectionIndex == -1) || ((SVar10 & DayOfWeekSectionMask) != NoSection)) ||
         ((!bVar20 && ((SVar10 & (YearSectionMask|MonthSection)) != NoSection)))) {
        day = weekDayWithinMonth(local_170->d_ptr,year,month,day,dayofweek);
      }
    }
    if ((SVar10 & DaySectionMask) == NoSection) {
      if ((this->cachedDay <= day) || (((local_18c.i & 0x3000) != 0 && (SVar28 == Acceptable))))
      goto LAB_00419d3f;
      bVar30 = true;
      day = this->cachedDay;
    }
    else {
      this->cachedDay = day;
LAB_00419d3f:
      bVar30 = false;
    }
    bVar6 = QCalendar::isDateValid(local_170,year,month,day);
    iVar12 = day;
    if (!bVar6) {
      iVar11 = QCalendar::maximumDaysInMonth(local_170);
      iVar7 = day;
      if (iVar12 <= iVar11) {
        this->cachedDay = day;
      }
      iVar12 = QCalendar::minimumDaysInMonth(local_170);
      if ((iVar12 < iVar7) && (bVar6 = QCalendar::isDateValid(local_170,year,month,1), bVar6)) {
        bVar30 = true;
      }
    }
    SVar29 = SVar28;
    if (bVar30) {
      if (this->context == FromString) goto LAB_00419b09;
      if ((SVar28 == Acceptable) && (this->fixday == true)) {
        iVar12 = QCalendar::daysInMonth(local_170,month,year);
        if (day < iVar12) {
          iVar12 = day;
        }
        namedZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        day = iVar12;
        (*this->_vptr_QDateTimeParser[6])(&namedZone,this);
        if (0 < (int)local_130) {
          local_158 = &this->m_text;
          iVar12 = 0;
          do {
            pSVar18 = sectionNode(this,iVar12);
            this_00 = local_170;
            uVar26._0_4_ = pSVar18->type;
            uVar26._4_4_ = pSVar18->pos;
            if (((uint)(undefined4)uVar26 >> 8 & 1) == 0) {
              if ((uVar26 & 0x3000) != 0) {
                QDate::QDate(&local_d0,year,month,day,local_170->d_ptr);
                iVar7 = QCalendar::dayOfWeek(this_00,local_d0);
                date.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
                QLocale::dayName((QString *)&date,(QLocale *)&namedZone,iVar7,
                                 (uint)((undefined4)uVar26 == 0x1000));
                sn.count = (int)extraout_RDX_00;
                sn.zeroesAdded = (int)((ulong)extraout_RDX_00 >> 0x20);
                sn.type = (undefined4)uVar26;
                sn.pos = uVar26._4_4_;
                iVar7 = sectionPos(this,sn);
                iVar11 = sectionSize(this,iVar12);
                QString::replace(local_158,(long)iVar7,(long)iVar11,(QString *)&date);
                goto LAB_00419f7a;
              }
            }
            else {
              sn_00.count = (int)extraout_RDX;
              sn_00.zeroesAdded = (int)((ulong)extraout_RDX >> 0x20);
              sn_00.type = (undefined4)uVar26;
              sn_00.pos = uVar26._4_4_;
              iVar7 = sectionPos(this,sn_00);
              iVar11 = sectionSize(this,iVar12);
              QLocale::toString((QString *)&date,(QLocale *)&namedZone,(long)day);
              QString::replace(local_158,(long)iVar7,(long)iVar11,(QString *)&date);
LAB_00419f7a:
              if (date.jd != 0) {
                LOCK();
                *(int *)date.jd = *(int *)date.jd + -1;
                UNLOCK();
                if (*(int *)date.jd == 0) {
                  QArrayData::deallocate((QArrayData *)date.jd,2,0x10);
                }
              }
            }
            iVar12 = iVar12 + 1;
          } while ((int)local_130 != iVar12);
        }
        QLocale::~QLocale((QLocale *)&namedZone);
      }
      else {
        SVar29 = Intermediate;
        if ((int)SVar28 < 1) {
          SVar29 = SVar28;
        }
      }
    }
  }
  iVar12 = hour;
  bVar30 = bVar20;
  if (this->parserType != QDate) {
    if ((local_18c.i & 0x10) == 0) {
      if (ampm != -1) {
        if ((local_18c.i & 0x20) == 0) {
          iVar12 = ampm * 0xc;
        }
        else {
          bVar30 = true;
          if (0xb < hour != (ampm == 0)) {
            bVar30 = bVar20;
          }
        }
      }
    }
    else {
      if (ampm == -1) {
        ampm = (int)(0xb < hour & (byte)local_18c.i >> 5);
      }
      hour12 = hour12 + (((uint)(hour12 / 6 + (hour12 >> 0x1f)) >> 1) - (hour12 >> 0x1f)) * -0xc +
               ampm * 0xc;
      iVar12 = hour12;
      if (((local_18c.i & 0x20) != 0) && (iVar12 = hour, bVar30 = true, hour == hour12)) {
        bVar30 = bVar20;
      }
    }
  }
  hour = iVar12;
  date.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QDate::QDate(&date,year,month,day,local_170->d_ptr);
  iVar11 = minute;
  iVar7 = second;
  iVar12 = msec;
  time.mds = -0x55555556;
  QTime::QTime(&time,hour,minute,second,msec);
  when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QVar19 = date;
  QDateTime::QDateTime(&when,date,time,&timeZone,LegacyBehavior);
  tVar13 = QDateTime::time(&when,(time_t *)QVar19.jd);
  SVar28 = SVar29;
  if (((int)tVar13 == time.mds) && (QVar19 = QDateTime::date(&when), QVar19.jd == date.jd)) {
LAB_0041a176:
    pSVar3 = local_168;
    QDateTime::QDateTime(&local_168->value,&when);
    pSVar3->state = SVar28;
    pSVar3->padded = local_17c;
    pSVar3->conflicts = bVar30;
  }
  else {
    if ((local_18c.i & 0x30) != 0) {
      SVar28 = Intermediate;
      if ((int)SVar29 < 1) {
        SVar28 = SVar29;
      }
      goto LAB_0041a176;
    }
    if (this->parserType == QDate) {
      _zoneOffset = (Data)0x2;
      QDate::startOfDay((QDate *)&namedZone,(QTimeZone *)&date);
LAB_0041a257:
      pSVar3 = local_168;
      QDateTime::QDateTime(&local_168->value,(QDateTime *)&namedZone);
      pSVar3->state = SVar29;
      pSVar3->padded = local_17c;
      pSVar3->conflicts = bVar30;
      QDateTime::~QDateTime((QDateTime *)&namedZone);
      QTimeZone::~QTimeZone((QTimeZone *)&zoneOffset);
    }
    else {
      if (this->parserType == QTime) {
        _zoneOffset = (Data)0x2;
        QDateTime::QDateTime
                  ((QDateTime *)&namedZone,date,time,(QTimeZone *)&zoneOffset,LegacyBehavior);
        goto LAB_0041a257;
      }
      __timer = (time_t *)QDateTime::toMSecsSinceEpoch(&when);
      namedZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
      QDateTime::fromMSecsSinceEpoch((QDateTime *)&namedZone,(qint64)__timer,&timeZone);
      zoneOffset = -0x55555556;
      tVar13 = QDateTime::time((QDateTime *)&namedZone,__timer);
      zoneOffset = (int)tVar13;
      QVar19 = QDateTime::date((QDateTime *)&namedZone);
      if ((((QVar19.jd != date.jd) ||
           (((local_18c.i & 8) != 0 &&
            (iVar25 = QTime::minute((QTime *)&zoneOffset), iVar25 != iVar11)))) ||
          (((local_18c.i & 4) != 0 &&
           (iVar11 = QTime::second((QTime *)&zoneOffset), iVar11 != iVar7)))) ||
         (((local_18c.i & 2) != 0 && (iVar7 = QTime::msec((QTime *)&zoneOffset), iVar7 != iVar12))))
      {
        QDateTime::~QDateTime((QDateTime *)&namedZone);
        goto LAB_0041a176;
      }
      pSVar3 = local_168;
      QDateTime::QDateTime(&local_168->value,(QDateTime *)&namedZone);
      pSVar3->state = SVar29;
      pSVar3->padded = local_17c;
      pSVar3->conflicts = bVar30;
      QDateTime::~QDateTime((QDateTime *)&namedZone);
    }
  }
  QDateTime::~QDateTime(&when);
LAB_0041a1af:
  QTimeZone::~QTimeZone(&timeZone);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_168;
}

Assistant:

QDateTimeParser::StateNode
QDateTimeParser::scanString(const QDateTime &defaultValue, bool fixup) const
{
    State state = Acceptable;
    bool conflicts = false;
    const int sectionNodesCount = sectionNodes.size();
    int padding = 0;
    int pos = 0;
    int year, month, day;
    const QDate defaultDate = defaultValue.date();
    const QTime defaultTime = defaultValue.time();
    defaultDate.getDate(&year, &month, &day);
    int year2digits = year % 100;
    int hour = defaultTime.hour();
    int hour12 = -1;
    int minute = defaultTime.minute();
    int second = defaultTime.second();
    int msec = defaultTime.msec();
    int dayofweek = calendar.dayOfWeek(defaultDate);
    QTimeZone timeZone = defaultValue.timeRepresentation();

    int ampm = -1;
    Sections isSet = NoSection;

    for (int index = 0; index < sectionNodesCount; ++index) {
        Q_ASSERT(state != Invalid);
        const QString &separator = separators.at(index);
        int step = matchesSeparator(QStringView{m_text}.sliced(pos), separator);
        if (step == -1) {
            QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                      << "does not start with" << separator
                      << index << pos << currentSectionIndex;
            return StateNode();
        }
        pos += step;
        sectionNodes[index].pos = pos;
        int *current = nullptr;
        int zoneOffset; // Needed to serve as *current when setting zone
        const SectionNode sn = sectionNodes.at(index);
        const QDateTime usedDateTime = [&] {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            const QTime time = actualTime(isSet, hour, hour12, ampm, minute, second, msec);
            return QDateTime(date, time, timeZone);
        }();
        ParsedSection sect = parseSection(usedDateTime, index, pos);

        QDTPDEBUG << "sectionValue" << sn.name() << m_text
                  << "pos" << pos << "used" << sect.used << stateName(sect.state);

        padding += sect.zeroes;
        if (fixup && sect.state == Intermediate && sect.used < sn.count) {
            const FieldInfo fi = fieldInfo(index);
            if ((fi & (Numeric|FixedWidth)) == (Numeric|FixedWidth)) {
                const QString newText = QString::asprintf("%0*d", sn.count, sect.value);
                m_text.replace(pos, sect.used, newText);
                sect.used = sn.count;
            }
        }

        state = qMin<State>(state, sect.state);
        // QDateTimeEdit can fix Intermediate and zeroes, but input needing that didn't match format:
        if (state == Invalid || (context == FromString && (state == Intermediate || sect.zeroes)))
            return StateNode();

        switch (sn.type) {
        case TimeZoneSection:
            current = &zoneOffset;
            if (sect.used > 0) {
                // Synchronize with what findTimeZone() found:
                QStringView zoneName = QStringView{m_text}.sliced(pos, sect.used);
                Q_ASSERT(!zoneName.isEmpty()); // sect.used > 0

                const QStringView offsetStr
                    = zoneName.startsWith("UTC"_L1) ? zoneName.sliced(3) : zoneName;
                const bool isUtcOffset = offsetStr.startsWith(u'+') || offsetStr.startsWith(u'-');
                const bool isUtc = zoneName == "Z"_L1 || zoneName == "UTC"_L1;

                if (isUtc || isUtcOffset) {
                    timeZone = QTimeZone::fromSecondsAheadOfUtc(sect.value);
#if QT_CONFIG(timezone)
                } else if (startsWithLocalTimeZone(zoneName, usedDateTime, locale()) != sect.used) {
                    QTimeZone namedZone = QTimeZone(zoneName.toLatin1());
                    Q_ASSERT(namedZone.isValid());
                    timeZone = namedZone;
#endif
                } else {
                    timeZone = QTimeZone::LocalTime;
                }
            }
            break;
        case Hour24Section: current = &hour; break;
        case Hour12Section: current = &hour12; break;
        case MinuteSection: current = &minute; break;
        case SecondSection: current = &second; break;
        case MSecSection: current = &msec; break;
        case YearSection: current = &year; break;
        case YearSection2Digits: current = &year2digits; break;
        case MonthSection: current = &month; break;
        case DayOfWeekSectionShort:
        case DayOfWeekSectionLong: current = &dayofweek; break;
        case DaySection: current = &day; sect.value = qMax<int>(1, sect.value); break;
        case AmPmSection: current = &ampm; break;
        default:
            qWarning("QDateTimeParser::parse Internal error (%ls)",
                     qUtf16Printable(sn.name()));
            return StateNode();
        }
        Q_ASSERT(current);
        Q_ASSERT(sect.state != Invalid);

        if (sect.used > 0)
            pos += sect.used;
        QDTPDEBUG << index << sn.name() << "is set to"
                  << pos << "state is" << stateName(state);

        if (isSet & sn.type && *current != sect.value) {
            QDTPDEBUG << "CONFLICT " << sn.name() << *current << sect.value;
            conflicts = true;
            if (index != currentSectionIndex)
                continue;
        }
        *current = sect.value;

        // Record the present section:
        isSet |= sn.type;
    }

    int step = matchesSeparator(QStringView{m_text}.sliced(pos), separators.last());
    if (step == -1 || step + pos < m_text.size()) {
        QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                  << "does not match" << separators.last() << pos;
        return StateNode();
    }

    if (parserType != QMetaType::QTime) {
        if (year % 100 != year2digits && (isSet & YearSection2Digits)) {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            if (!date.isValid()) {
                state = Invalid;
            } else if (!(isSet & YearSection)) {
                year = date.year();
            } else {
                conflicts = true;
                const SectionNode &sn = sectionNode(currentSectionIndex);
                if (sn.type == YearSection2Digits)
                    year = date.year();
            }
        }

        const auto fieldType = sectionType(currentSectionIndex);
        const QDate date(year, month, day, calendar);
        if ((!date.isValid() || dayofweek != calendar.dayOfWeek(date))
                && state == Acceptable && isSet & DayOfWeekSectionMask) {
            if (isSet & DaySection)
                conflicts = true;
            // Change to day of week should adjust day of month;
            // when day of month isn't set, so should change to year or month.
            if (currentSectionIndex == -1 || fieldType & DayOfWeekSectionMask
                    || (!conflicts && (fieldType & (YearSectionMask | MonthSection)))) {
                day = weekDayWithinMonth(calendar, year, month, day, dayofweek);
                QDTPDEBUG << year << month << day << dayofweek
                          << calendar.dayOfWeek(QDate(year, month, day, calendar));
            }
        }

        bool needfixday = false;
        if (fieldType & DaySectionMask) {
            cachedDay = day;
        } else if (cachedDay > day && !(isSet & DayOfWeekSectionMask && state == Acceptable)) {
            day = cachedDay;
            needfixday = true;
        }

        if (!calendar.isDateValid(year, month, day)) {
            if (day <= calendar.maximumDaysInMonth())
                cachedDay = day;
            if (day > calendar.minimumDaysInMonth() && calendar.isDateValid(year, month, 1))
                needfixday = true;
        }
        if (needfixday) {
            if (context == FromString)
                return StateNode();
            if (state == Acceptable && fixday) {
                day = qMin<int>(day, calendar.daysInMonth(month, year));

                const QLocale loc = locale();
                for (int i=0; i<sectionNodesCount; ++i) {
                    const SectionNode sn = sectionNode(i);
                    if (sn.type & DaySection) {
                        m_text.replace(sectionPos(sn), sectionSize(i), loc.toString(day));
                    } else if (sn.type & DayOfWeekSectionMask) {
                        const int dayOfWeek = calendar.dayOfWeek(QDate(year, month, day, calendar));
                        const QLocale::FormatType dayFormat =
                            (sn.type == DayOfWeekSectionShort
                             ? QLocale::ShortFormat : QLocale::LongFormat);
                        const QString dayName(loc.dayName(dayOfWeek, dayFormat));
                        m_text.replace(sectionPos(sn), sectionSize(i), dayName);
                    }
                }
            } else if (state > Intermediate) {
                state = Intermediate;
            }
        }
    }

    if (parserType != QMetaType::QDate) {
        if (isSet & Hour12Section) {
            const bool hasHour = isSet.testAnyFlag(Hour24Section);
            if (ampm == -1) // If we don't know from hour, assume am:
                ampm = !hasHour || hour < 12 ? 0 : 1;
            hour12 = hour12 % 12 + ampm * 12;
            if (!hasHour)
                hour = hour12;
            else if (hour != hour12)
                conflicts = true;
        } else if (ampm != -1) {
            if (!(isSet & (Hour24Section)))
                hour = 12 * ampm; // Special case: only ap section
            else if ((ampm == 0) != (hour < 12))
                conflicts = true;
        }
    }

    QDTPDEBUG << year << month << day << hour << minute << second << msec;
    Q_ASSERT(state != Invalid);

    const QDate date(year, month, day, calendar);
    const QTime time(hour, minute, second, msec);
    const QDateTime when = QDateTime(date, time, timeZone);

    if (when.time() != time || when.date() != date) {
        // In a spring-forward, if we hit the skipped hour, we may have been
        // shunted out of it.

        // If hour wasn't specified, so we're using our default, changing it may
        // fix that.
        if (!(isSet & HourSectionMask)) {
            switch (parserType) {
            case QMetaType::QDateTime: {
                qint64 msecs = when.toMSecsSinceEpoch();
                // Fortunately, that gets a useful answer, even though when is invalid ...
                const QDateTime replace = QDateTime::fromMSecsSinceEpoch(msecs, timeZone);
                const QTime tick = replace.time();
                if (replace.date() == date
                    && (!(isSet & MinuteSection) || tick.minute() == minute)
                    && (!(isSet & SecondSection) || tick.second() == second)
                    && (!(isSet & MSecSection)   || tick.msec() == msec)) {
                    return StateNode(replace, state, padding, conflicts);
                }
            } break;
            case QMetaType::QDate:
                // Don't care about time, so just use start of day (and ignore spec):
                return StateNode(date.startOfDay(QTimeZone::UTC),
                                 state, padding, conflicts);
                break;
            case QMetaType::QTime:
                // Don't care about date or representation, so pick a safe representation:
                return StateNode(QDateTime(date, time, QTimeZone::UTC),
                                 state, padding, conflicts);
            default:
                Q_UNREACHABLE_RETURN(StateNode());
            }
        } else if (state > Intermediate) {
            state = Intermediate;
        }
    }

    return StateNode(when, state, padding, conflicts);
}